

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlUnmarshall.c
# Opt level: O3

JL_STATUS UnmarshallDictionary
                    (JlDataObject *DictionaryObject,JlMarshallElement *StructDescription,
                    size_t StructDescriptionCount,_Bool IgnoreExistingValuesInStruct,void *Structure
                    ,size_t *pErrorAtPos)

{
  size_t sVar1;
  JL_STATUS JVar2;
  JL_DATA_TYPE JVar3;
  uint32_t uVar4;
  size_t ListCount;
  undefined8 *puVar5;
  size_t sVar6;
  undefined7 in_register_00000009;
  void *pvVar7;
  void **listPtr;
  undefined8 *Output;
  JlDataObject *pJVar8;
  ulong uVar9;
  JlMarshallElement *pJVar10;
  ulong uVar11;
  ulong CountValue;
  JlDataObject *object;
  JlListItem *enumerator;
  JlDataObject *local_a0;
  undefined4 local_94;
  JlDataObject *local_90;
  size_t *local_88;
  size_t local_80;
  void *local_78;
  JlDataObject *local_70;
  JlListItem *local_68;
  ulong local_60;
  size_t local_58;
  void *local_50;
  size_t local_48;
  JlMarshallElement *local_40;
  JlDataObject *local_38;
  
  local_94 = (undefined4)CONCAT71(in_register_00000009,IgnoreExistingValuesInStruct);
  if (StructDescriptionCount == 0) {
    return JL_STATUS_SUCCESS;
  }
  uVar9 = 0;
  local_88 = pErrorAtPos;
  local_80 = StructDescriptionCount;
  local_50 = Structure;
  local_40 = StructDescription;
  local_38 = DictionaryObject;
  do {
    pJVar10 = local_40;
    local_90 = (JlDataObject *)0x0;
    JVar2 = JlGetObjectFromDictionaryByKey(local_38,local_40[uVar9].Name,&local_90);
    pvVar7 = local_50;
    if (JVar2 == JL_STATUS_SUCCESS) {
      pJVar10 = pJVar10 + uVar9;
      Output = (undefined8 *)(pJVar10->FieldOffset + (long)local_50);
      JVar3 = JlGetObjectType(local_90);
      pJVar8 = local_90;
      if ((JVar3 == JL_DATA_TYPE_LIST & pJVar10->IsArray) == 1) {
        uVar4 = JlGetListCount(local_90);
        JVar2 = JlMemoryVerifyCountFieldLargeEnoughForValue(pJVar10->CountFieldSize,(ulong)uVar4);
        if (JVar2 == JL_STATUS_SUCCESS) {
          pvVar7 = (void *)(pJVar10->CountFieldOffset + (long)local_50);
          sVar6 = pJVar10->CountFieldSize;
          local_70 = local_90;
          uVar4 = JlGetListCount(local_90);
          local_60 = CONCAT44(local_60._4_4_,uVar4);
          ListCount = JlMemoryReadCountValue(pvVar7,sVar6);
          local_78 = pvVar7;
          local_48 = sVar6;
          JlMemoryWriteCountValue(pvVar7,sVar6,0);
          if (((char)local_94 == '\0') && (ListCount != 0)) {
            FreeUnmarshalledList(pJVar10,Output,ListCount);
          }
          pErrorAtPos = local_88;
          sVar1 = pJVar10->ArrayFieldSize;
          if ((int)local_60 == 0) {
            if (sVar1 == 0) {
              *Output = 0;
              StructDescriptionCount = local_80;
              JVar2 = JL_STATUS_SUCCESS;
            }
            else {
              memset(Output,0,sVar1);
              StructDescriptionCount = local_80;
              JVar2 = JL_STATUS_SUCCESS;
            }
            goto LAB_00104634;
          }
          uVar11 = local_60 & 0xffffffff;
          if (sVar1 == 0) {
            puVar5 = (undefined8 *)WjTestLib_Calloc(pJVar10->ArrayItemSize * uVar11,1);
            if (puVar5 != (undefined8 *)0x0) {
              *Output = puVar5;
              goto LAB_0010479e;
            }
            JVar2 = JL_STATUS_OUT_OF_MEMORY;
          }
          else {
            memset(Output,0,sVar1);
            JVar2 = JL_STATUS_TOO_MANY_ITEMS;
            puVar5 = Output;
            if (uVar11 <= pJVar10->ArrayFieldSize / pJVar10->ArrayItemSize) {
LAB_0010479e:
              local_68 = (JlListItem *)0x0;
              CountValue = 0;
              local_60 = uVar11;
              do {
                sVar6 = pJVar10->ArrayItemSize;
                local_a0 = (JlDataObject *)0x0;
                JVar2 = JlGetObjectListNextItem(local_70,&local_a0,&local_68);
                pErrorAtPos = local_88;
                if (JVar2 != JL_STATUS_SUCCESS) goto LAB_001048a8;
                JVar3 = JlGetObjectType(local_a0);
                pErrorAtPos = local_88;
                if (pJVar10->Type != JVar3) {
                  JVar2 = JL_STATUS_WRONG_TYPE;
                  if (local_88 != (size_t *)0x0) {
                    sVar6 = JlGetObjectTag(local_a0);
                    *pErrorAtPos = sVar6;
                  }
                  goto LAB_001048a8;
                }
                JVar2 = UnmarshalObject(local_a0,pJVar10,(_Bool)(char)local_94,
                                        (undefined8 *)(sVar6 * CountValue + (long)puVar5),local_88);
                if (JVar2 != JL_STATUS_SUCCESS) goto LAB_001048a8;
                CountValue = CountValue + 1;
                JlMemoryWriteCountValue(local_78,local_48,CountValue);
              } while (CountValue < local_60);
              JVar2 = JL_STATUS_SUCCESS;
            }
          }
LAB_001048a8:
          if (((pErrorAtPos != (size_t *)0x0) && (JVar2 != JL_STATUS_SUCCESS)) &&
             (*pErrorAtPos == 0)) {
            sVar6 = JlGetObjectTag(local_70);
            *pErrorAtPos = sVar6;
          }
        }
        StructDescriptionCount = local_80;
        if ((pErrorAtPos != (size_t *)0x0) && (JVar2 != JL_STATUS_SUCCESS)) {
          if (*pErrorAtPos != 0) {
            return JVar2;
          }
LAB_0010493a:
          sVar6 = JlGetObjectTag(local_90);
          *pErrorAtPos = sVar6;
          return JVar2;
        }
      }
      else {
        if (pJVar10->Type != JVar3) {
          JVar2 = JL_STATUS_WRONG_TYPE;
          if (pErrorAtPos == (size_t *)0x0) {
            return JL_STATUS_WRONG_TYPE;
          }
          goto LAB_0010493a;
        }
        if (pJVar10->IsBase64 != true) {
          JVar2 = UnmarshalObject(local_90,pJVar10,(_Bool)(char)local_94,Output,pErrorAtPos);
          StructDescriptionCount = local_80;
          goto LAB_00104634;
        }
        pvVar7 = (void *)(pJVar10->CountFieldOffset + (long)pvVar7);
        local_78 = (void *)pJVar10->CountFieldSize;
        local_68 = (JlListItem *)0x0;
        puVar5 = Output;
        if (pJVar10->FieldSize != 0) {
          puVar5 = (undefined8 *)0x0;
        }
        if ((((_Bool)(char)local_94 == false) && (pJVar10->FieldSize == 0)) &&
           ((void *)*Output != (void *)0x0)) {
          WjTestLib_Free((void *)*Output);
          *Output = 0;
        }
        local_70 = pJVar8;
        JVar2 = JlGetObjectString(pJVar8,(char **)&local_68);
        if (JVar2 == JL_STATUS_SUCCESS) {
          local_a0 = (JlDataObject *)0x0;
          local_58 = 0;
          if (local_68 == (JlListItem *)0x0) {
            JVar2 = JL_STATUS_INVALID_DATA;
            if (pJVar10->FieldSize == 0) {
              *puVar5 = 0;
              JVar2 = JlMemoryWriteCountValue(pvVar7,(size_t)local_78,0);
            }
          }
          else {
            JVar2 = JlBase64Decode((char *)local_68,&local_a0,&local_58);
            pJVar8 = local_a0;
            if (JVar2 == JL_STATUS_SUCCESS) {
              sVar1 = pJVar10->FieldSize;
              if (sVar1 == 0) {
                *puVar5 = local_a0;
                JVar2 = JlMemoryWriteCountValue(pvVar7,(size_t)local_78,local_58);
                if (JVar2 == JL_STATUS_SUCCESS) {
                  JVar2 = JL_STATUS_SUCCESS;
                  goto LAB_001045f7;
                }
                *puVar5 = 0;
                pJVar8 = local_a0;
              }
              else {
                JVar2 = JL_STATUS_INVALID_DATA;
                if (local_58 == sVar1) {
                  memcpy(Output,local_a0,sVar1);
                  JVar2 = JL_STATUS_SUCCESS;
                }
              }
              WjTestLib_Free(pJVar8);
            }
          }
        }
LAB_001045f7:
        pErrorAtPos = local_88;
        StructDescriptionCount = local_80;
        if ((local_88 != (size_t *)0x0) && (JVar2 != JL_STATUS_SUCCESS)) {
          sVar6 = JlGetObjectTag(local_70);
          *pErrorAtPos = sVar6;
          StructDescriptionCount = local_80;
        }
      }
    }
    else if (JVar2 == JL_STATUS_NOT_FOUND) {
      JVar2 = JL_STATUS_SUCCESS;
    }
LAB_00104634:
    uVar9 = (ulong)((int)uVar9 + 1);
    if (StructDescriptionCount <= uVar9) {
      return JVar2;
    }
    if (JVar2 != JL_STATUS_SUCCESS) {
      return JVar2;
    }
  } while( true );
}

Assistant:

static
JL_STATUS
    UnmarshallDictionary
    (
        JlDataObject const*         DictionaryObject,
        JlMarshallElement const*    StructDescription,
        size_t                      StructDescriptionCount,
        bool                        IgnoreExistingValuesInStruct,
        void*                       Structure,
        size_t*                     pErrorAtPos
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( uint32_t i=0; i<StructDescriptionCount && JL_STATUS_SUCCESS==jlStatus; i++ )
    {
        JlMarshallElement const* currentItem = &StructDescription[i];

        // Get object
        JlDataObject* object = NULL;
        JL_DATA_TYPE objectType = JL_DATA_TYPE_NONE;

        jlStatus = JlGetObjectFromDictionaryByKey( DictionaryObject, currentItem->Name, &object );
        if( JL_STATUS_SUCCESS == jlStatus )
        {
            void* elementInStruct = (void*)(((uint8_t*)Structure)+currentItem->FieldOffset);
            objectType = JlGetObjectType( object );

            if( currentItem->IsArray && JL_DATA_TYPE_LIST == objectType )
            {
                // First verify that the count field is large enough
                size_t arrayCount = JlGetListCount( object );
                jlStatus = JlMemoryVerifyCountFieldLargeEnoughForValue( currentItem->CountFieldSize, arrayCount );
                if( JL_STATUS_SUCCESS == jlStatus )
                {
                    // Unmarshall the list
                    void* arrayCountPtr = ((uint8_t*)Structure) + currentItem->CountFieldOffset;
                    jlStatus = UnmarshalList(
                        object,
                        currentItem,
                        IgnoreExistingValuesInStruct,
                        elementInStruct,
                        arrayCountPtr,
                        currentItem->CountFieldSize,
                        pErrorAtPos );
                }

                if( JL_STATUS_SUCCESS != jlStatus )
                {
                    if( NULL != pErrorAtPos && 0 == *pErrorAtPos )
                    {
                        *pErrorAtPos = JlGetObjectTag( object );
                    }
                }
            }
            else if( currentItem->Type == objectType )
            {
                if( currentItem->IsBase64 )
                {
                    void* dataSizeElementInStruct = (void*)(((uint8_t*)Structure)+currentItem->CountFieldOffset);
                    jlStatus = UnmarshalBinary( object, dataSizeElementInStruct, currentItem->CountFieldSize, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
                else
                {
                    jlStatus = UnmarshalObject( object, currentItem, IgnoreExistingValuesInStruct, elementInStruct, pErrorAtPos );
                }
            }
            else
            {
                // Wrong type
                jlStatus = JL_STATUS_WRONG_TYPE;
                if( NULL != pErrorAtPos )
                {
                    *pErrorAtPos = JlGetObjectTag( object );
                }
            }

        }
        else if( JL_STATUS_NOT_FOUND == jlStatus )
        {
            // Keyname not found in dictionary. Do not consider this an error, we just don't have any value for this item, so we leave
            // it as default
            jlStatus = JL_STATUS_SUCCESS;
        }
    }

    return jlStatus;
}